

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::sendSignal(Thread *this,int signo)

{
  Fault local_20;
  Fault f;
  int pthreadResult;
  int signo_local;
  Thread *this_local;
  
  f.exception._4_4_ = signo;
  f.exception._0_4_ = pthread_kill(this->threadId,signo);
  if ((int)f.exception != 0) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x71,(int)f.exception,"pthread_kill","");
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return;
}

Assistant:

void Thread::sendSignal(int signo) {
  int pthreadResult = pthread_kill(*reinterpret_cast<pthread_t*>(&threadId), signo);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_kill", pthreadResult) { break; }
  }
}